

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatMemory.h
# Opt level: O0

uint xSAT_MemAppend(xSAT_Mem_t *p,int nSize)

{
  uint uVar1;
  uint nPrevSize;
  int nSize_local;
  xSAT_Mem_t *p_local;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                  ,0xa0,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
  }
  xSAT_MemGrow(p,p->nSize + nSize);
  uVar1 = p->nSize;
  p->nSize = nSize + p->nSize;
  if (uVar1 < p->nSize) {
    return uVar1;
  }
  __assert_fail("p->nSize > nPrevSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatMemory.h"
                ,0xa4,"unsigned int xSAT_MemAppend(xSAT_Mem_t *, int)");
}

Assistant:

static inline unsigned xSAT_MemAppend( xSAT_Mem_t * p, int nSize )
{
    unsigned nPrevSize;
    assert(nSize > 0);
    xSAT_MemGrow( p, p->nSize + nSize );
    nPrevSize = p->nSize;
    p->nSize += nSize;
    assert(p->nSize > nPrevSize);
    return nPrevSize;
}